

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O0

void __thiscall jaegertracing::propagation::BinaryPropagator::inject(BinaryPropagator *this)

{
  ostream *in_RDX;
  SpanContext *in_RSI;
  
  inject((BinaryPropagator *)
         &this[-1]._metrics.
          super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount,in_RSI,in_RDX);
  return;
}

Assistant:

void inject(const SpanContext& ctx, std::ostream& out) const override
    {
        writeBinary(out, ctx.traceID().high());
        writeBinary(out, ctx.traceID().low());
        writeBinary(out, ctx.spanID());
        writeBinary(out, ctx.parentID());
        // `flags` is a single byte, so endianness is not an issue.
        out.put(ctx.flags());

        writeBinary(out, static_cast<uint32_t>(ctx.baggage().size()));
        for (auto&& pair : ctx.baggage()) {
            auto&& key = pair.first;
            writeBinary(out, static_cast<uint32_t>(key.size()));
            out.write(key.c_str(), key.size());

            auto&& value = pair.second;
            writeBinary(out, static_cast<uint32_t>(value.size()));
            out.write(value.c_str(), value.size());
        }
    }